

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::StreamingReporterBase::StreamingReporterBase
          (StreamingReporterBase *this,ReporterConfig *_config)

{
  IConfig *pIVar1;
  
  (this->super_SharedImpl<Catch::IStreamingReporter>).m_rc = 0;
  (this->super_SharedImpl<Catch::IStreamingReporter>).super_IStreamingReporter.super_IShared.
  super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__ConsoleReporter_00161448;
  pIVar1 = (_config->m_fullConfig).m_p;
  (this->m_config).m_p = pIVar1;
  if (pIVar1 != (IConfig *)0x0) {
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[2])();
  }
  (this->testRunInfo).nullableValue = (TestRunInfo *)0x0;
  (this->unusedGroupInfo).nullableValue = (GroupInfo *)0x0;
  (this->unusedTestCaseInfo).nullableValue = (TestCaseInfo *)0x0;
  (this->currentSectionInfo).m_p = (ThreadedSectionInfo *)0x0;
  this->stream = _config->m_stream;
  (this->m_rootSections).
  super__Vector_base<Catch::Ptr<Catch::ThreadedSectionInfo>,_std::allocator<Catch::Ptr<Catch::ThreadedSectionInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_rootSections).
  super__Vector_base<Catch::Ptr<Catch::ThreadedSectionInfo>,_std::allocator<Catch::Ptr<Catch::ThreadedSectionInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_rootSections).
  super__Vector_base<Catch::Ptr<Catch::ThreadedSectionInfo>,_std::allocator<Catch::Ptr<Catch::ThreadedSectionInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

StreamingReporterBase( ReporterConfig const& _config )
        :   m_config( _config.fullConfig() ),
            stream( _config.stream() )
        {}